

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::button::button(button *this,int bit)

{
  int iVar1;
  file_descriptor *__p;
  allocator_type local_21;
  
  (this->onclick).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onclick)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onclick).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onclick).super__Function_base._M_functor + 8) = 0;
  this->_bit = bit;
  this->_state = false;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_buf,0xc,&local_21);
  __p = (file_descriptor *)operator_new(4);
  iVar1 = open("/dev/input/by-path/platform-gpio_keys-event",0);
  __p->_fd = iVar1;
  std::__shared_ptr<ev3dev::button::file_descriptor,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ev3dev::button::file_descriptor,void>
            ((__shared_ptr<ev3dev::button::file_descriptor,(__gnu_cxx::_Lock_policy)2> *)&this->_fd,
             __p);
  return;
}

Assistant:

button::button(int bit)
    : _bit(bit),
      _buf((KEY_CNT + bits_per_long - 1) / bits_per_long),
      _fd( new file_descriptor("/dev/input/by-path/platform-gpio_keys-event", O_RDONLY) )
{ }